

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O2

int run_test_handle_type_name(void)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  undefined8 uStack_10;
  
  pcVar2 = (char *)uv_handle_type_name(7);
  iVar1 = strcmp(pcVar2,"pipe");
  if (iVar1 == 0) {
    pcVar2 = (char *)uv_handle_type_name(0xf);
    iVar1 = strcmp(pcVar2,"udp");
    if (iVar1 == 0) {
      pcVar2 = (char *)uv_handle_type_name(0x11);
      iVar1 = strcmp(pcVar2,"file");
      if (iVar1 == 0) {
        lVar3 = uv_handle_type_name(0x12);
        if (lVar3 == 0) {
          lVar3 = uv_handle_type_name(0x13);
          if (lVar3 == 0) {
            lVar3 = uv_handle_type_name(0);
            if (lVar3 == 0) {
              return 0;
            }
            pcVar2 = "uv_handle_type_name(UV_UNKNOWN_HANDLE) == NULL";
            uStack_10 = 0x11;
          }
          else {
            pcVar2 = "uv_handle_type_name(UV_HANDLE_TYPE_MAX + 1) == NULL";
            uStack_10 = 0x10;
          }
        }
        else {
          pcVar2 = "uv_handle_type_name(UV_HANDLE_TYPE_MAX) == NULL";
          uStack_10 = 0xf;
        }
      }
      else {
        pcVar2 = "strcmp(uv_handle_type_name(UV_FILE), \"file\") == 0";
        uStack_10 = 0xe;
      }
    }
    else {
      pcVar2 = "strcmp(uv_handle_type_name(UV_UDP), \"udp\") == 0";
      uStack_10 = 0xd;
    }
  }
  else {
    pcVar2 = "strcmp(uv_handle_type_name(UV_NAMED_PIPE), \"pipe\") == 0";
    uStack_10 = 0xc;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(handle_type_name) {
  ASSERT(strcmp(uv_handle_type_name(UV_NAMED_PIPE), "pipe") == 0);
  ASSERT(strcmp(uv_handle_type_name(UV_UDP), "udp") == 0);
  ASSERT(strcmp(uv_handle_type_name(UV_FILE), "file") == 0);
  ASSERT(uv_handle_type_name(UV_HANDLE_TYPE_MAX) == NULL);
  ASSERT(uv_handle_type_name(UV_HANDLE_TYPE_MAX + 1) == NULL);
  ASSERT(uv_handle_type_name(UV_UNKNOWN_HANDLE) == NULL);
  return 0;
}